

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O2

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  pthread_mutex_t *__mutex;
  pointer puVar1;
  long lVar2;
  Size_t SVar3;
  Size_t SVar4;
  
  __mutex = (pthread_mutex_t *)this->mtx_;
  std::mutex::lock((mutex *)&__mutex->__data);
  puVar1 = (this->events_->
           super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  SVar3 = (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (SVar3 != from) {
    SVar4 = from;
    do {
      from = SVar3;
      if (SVar3 - 1 == SVar4) break;
      from = SVar4 + 1;
      lVar2 = SVar4 + 1;
      SVar4 = from;
    } while ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
             puVar1[lVar2]._M_t.
             super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t ==
             (_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)0x0);
  }
  pthread_mutex_unlock(__mutex);
  return from;
}

Assistant:

auto find_next(Size_t from) -> Size_t
            {
                Guard_t g{mtx_};
                const auto end = events_.size();
                if (from == end)
                    return from;
                while (++from != end && events_[from] == nullptr) {}
                return from;
            }